

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O1

ostream * operator<<(ostream *os,KmerCounter *kc)

{
  size_type sVar1;
  pointer pcVar2;
  ostream *poVar3;
  uint __val;
  uint uVar4;
  uint __len;
  string __str;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"KmerCounter ",0xc);
  sVar1 = (kc->name)._M_string_length;
  local_70 = local_60;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unnamed","");
  }
  else {
    pcVar2 = (kc->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar2,pcVar2 + sVar1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": index with ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  uVar4 = (uint)kc->k;
  __val = -uVar4;
  if (0 < (int)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    __len = 3 - (__val < 100);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (kc->k >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50 + (ulong)(uVar4 >> 0x1f)),__len,__val);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-mers",5);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const KmerCounter &kc) {
    os << "KmerCounter "<< ( kc.name.empty() ? "unnamed":kc.name ) <<": index with "<<kc.kindex.size()<<" "<<std::to_string(kc.k)<<"-mers";
    return os;
}